

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

BigInt * __thiscall
BigInt::karatsuba(BigInt *__return_storage_ptr__,BigInt *this,BigInt *a,BigInt *b)

{
  uint uVar1;
  uint uVar2;
  BigInt local_198;
  BigInt *local_178;
  BigInt z1;
  BigInt cc;
  BigInt aa;
  BigInt z2;
  BigInt z0;
  BigInt dd;
  BigInt bb;
  BigInt local_90;
  BigInt local_70;
  BigInt local_50;
  
  uVar1 = get_real_length(a);
  uVar2 = get_real_length(b);
  if ((int)(uVar1 - uVar2) < 0xb && (499 < (int)uVar2 && 499 < (int)uVar1)) {
    if (uVar2 < uVar1) {
      uVar1 = uVar2;
    }
    uVar2 = uVar1 >> 1;
    local_178 = __return_storage_ptr__;
    sub_value(&bb,a,1,uVar2);
    sub_value(&aa,a,uVar2 + 1,-1);
    sub_value(&dd,b,1,uVar2);
    sub_value(&cc,b,uVar2 + 1,-1);
    karatsuba(&z2,this,&aa,&cc);
    karatsuba(&z0,this,&bb,&dd);
    add(&local_50,&aa,&bb);
    operator=(&aa,&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
    add(&local_70,&cc,&dd);
    operator=(&cc,&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
    karatsuba(&z1,this,&aa,&cc);
    operator-(&local_198,&z1,&z0);
    operator-(&local_90,&local_198,&z2);
    operator=(&z1,&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_198);
    local_198.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::insert
              (&z2.value,
               (const_iterator)
               (z2.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1),(ulong)(uVar1 & 0x7ffffffe),
               (value_type_conflict2 *)&local_198);
    local_198.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::insert
              (&z1.value,
               (const_iterator)
               (z1.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + 1),(ulong)uVar2,
               (value_type_conflict2 *)&local_198);
    add(&local_198,&z2,&z1);
    __return_storage_ptr__ = local_178;
    add(local_178,&local_198,&z0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_198);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&z1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&z0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&z2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&cc);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&dd);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&aa);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&bb);
  }
  else {
    simple_multiply(__return_storage_ptr__,a,b);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::karatsuba(BigInt& a, BigInt& b) {
    int len_a = a.get_real_length();
    int len_b = b.get_real_length();
    if (len_a < 500 || len_b < 500 || (len_a - len_b) > 10) {
        return a.simple_multiply(b);
    }
    int half = min(len_a, len_b) / 2;

    BigInt bb = a.sub_value(1, half);
    BigInt aa = a.sub_value(half + 1, -1);
    BigInt dd = b.sub_value(1, half);
    BigInt cc = b.sub_value(half + 1, -1);

    BigInt z2 = this->karatsuba(aa, cc);
    BigInt z0 = this->karatsuba(bb, dd);
    aa = aa + bb;
    cc = cc + dd;
    BigInt z1 = this->karatsuba(aa, cc);
    z1 = z1 - z0 - z2;

    z2.value.insert(z2.value.begin() + 1, 2 * half, 0);
    z1.value.insert(z1.value.begin() + 1, half, 0);

    return z2 + z1 + z0;
    ;
}